

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveproxy.cpp
# Opt level: O0

int __thiscall naiveproxy::init_proxys(naiveproxy *this)

{
  __pid_t _Var1;
  char *pcVar2;
  naiveconfig *this_00;
  naiveproxy *pnVar3;
  reference ppnVar4;
  bool bVar5;
  httpproxy *local_468;
  proxy *pro_1;
  proxy *pro;
  iterator iStack_450;
  pid_t pid;
  _Self local_448;
  iterator it;
  naiveconfig *local_430;
  naiveconfig *cfg;
  char *p;
  char *p_str;
  char str [1024];
  FILE *fp;
  naiveproxy *this_local;
  
  signal(0x11,(__sighandler_t)0x1);
  str._1016_8_ = fopen("/etc/naiveproxy.conf","r");
  if ((FILE *)str._1016_8_ == (FILE *)0x0) {
    printf(anon_var_dwarf_e90e,"/etc/naiveproxy.conf");
    exit(0);
  }
  while (pcVar2 = fgets((char *)&p_str,0x400,(FILE *)str._1016_8_), pcVar2 != (char *)0x0) {
    p = (char *)&p_str;
    while( true ) {
      bVar5 = true;
      if ((*p != ' ') && (bVar5 = true, *p != '\t')) {
        bVar5 = *p == '\n';
      }
      if (!bVar5) break;
      p = p + 1;
    }
    cfg = (naiveconfig *)p;
    while( true ) {
      bVar5 = false;
      if ((char)cfg->proxy_ipaddr != '\0') {
        bVar5 = (char)cfg->proxy_ipaddr != '#';
      }
      if (!bVar5) break;
      cfg = (naiveconfig *)((long)&cfg->proxy_ipaddr + 1);
    }
    *(undefined1 *)&cfg->proxy_ipaddr = 0;
    if (*p != '\0') {
      this_00 = (naiveconfig *)operator_new(0x38);
      naiveconfig::naiveconfig(this_00,p);
      local_430 = this_00;
      std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::push_front
                (&this->cfgs,&local_430);
    }
  }
  local_448._M_node =
       (_List_node_base *)
       std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::begin(&this->cfgs);
  do {
    iStack_450 = std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::end(&this->cfgs)
    ;
    bVar5 = std::operator!=(&local_448,&stack0xfffffffffffffbb0);
    if (!bVar5) {
      return 0;
    }
    if ((this->daemonized & 1U) == 0) {
      local_468 = (httpproxy *)0x0;
      ppnVar4 = std::_List_iterator<naiveconfig_*>::operator*(&local_448);
      if ((*ppnVar4)->protocol == '\0') {
        local_468 = (httpproxy *)operator_new(0x58);
        ppnVar4 = std::_List_iterator<naiveconfig_*>::operator*(&local_448);
        tcpproxy::tcpproxy((tcpproxy *)local_468,*ppnVar4);
      }
      else {
        ppnVar4 = std::_List_iterator<naiveconfig_*>::operator*(&local_448);
        if (((*ppnVar4)->protocol != '\x01') &&
           (ppnVar4 = std::_List_iterator<naiveconfig_*>::operator*(&local_448),
           (*ppnVar4)->protocol == '\x02')) {
          local_468 = (httpproxy *)operator_new(0x90);
          ppnVar4 = std::_List_iterator<naiveconfig_*>::operator*(&local_448);
          httpproxy::httpproxy(local_468,*ppnVar4);
        }
      }
      (*(local_468->super_tcpproxy).super_proxy._vptr_proxy[2])();
    }
    else {
      _Var1 = fork();
      if (_Var1 == 0) {
        pnVar3 = GetInstance();
        std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::clear(&pnVar3->cfgs);
        pro_1 = (proxy *)0x0;
        ppnVar4 = std::_List_iterator<naiveconfig_*>::operator*(&local_448);
        if ((*ppnVar4)->protocol == '\0') {
          pro_1 = (proxy *)operator_new(0x58);
          ppnVar4 = std::_List_iterator<naiveconfig_*>::operator*(&local_448);
          tcpproxy::tcpproxy((tcpproxy *)pro_1,*ppnVar4);
        }
        else {
          ppnVar4 = std::_List_iterator<naiveconfig_*>::operator*(&local_448);
          if (((*ppnVar4)->protocol != '\x01') &&
             (ppnVar4 = std::_List_iterator<naiveconfig_*>::operator*(&local_448),
             (*ppnVar4)->protocol == '\x02')) {
            pro_1 = (proxy *)operator_new(0x90);
            ppnVar4 = std::_List_iterator<naiveconfig_*>::operator*(&local_448);
            httpproxy::httpproxy((httpproxy *)pro_1,*ppnVar4);
          }
        }
        (*pro_1->_vptr_proxy[2])();
        exit(0);
      }
      if (_Var1 < 0) {
        exit(0);
      }
    }
    std::_List_iterator<naiveconfig_*>::operator++(&local_448,0);
  } while( true );
}

Assistant:

int naiveproxy::init_proxys()
{

    //忽略SIGCHID
    signal(SIGCHLD, SIG_IGN);

    FILE *fp;
    fp = fopen(CONFIG_FILE_NAME, "r");
    if (fp == NULL)
    {
        printf("打开文件%s失败\n", CONFIG_FILE_NAME);
        exit(0);
    }

    char str[1024];

    while (fgets(str, sizeof(str), fp) != NULL)
    {
        char *p_str = str;
        //删除前导空格等
        while (*p_str == ' ' || *p_str == '\t' || *p_str == '\n')
            p_str++;
        //删除注释
        char *p = p_str;
        while (*p && *p != '#')
            p++;
        *p = 0;
        if (*p_str == 0)
            continue;

        naiveconfig *cfg = new naiveconfig(p_str);
        //由于是push_front，所以配置文件可以看做是从下往上处理的
        cfgs.push_front(cfg);
    }

    for (auto it = cfgs.begin(); it != cfgs.end(); it++)
    {
        if (daemonized)
        {
            pid_t pid;
            pid = fork();
            if (pid == 0)
            {
                //naiveproxy::DestroyInstance();
                naiveproxy::GetInstance()->cfgs.clear();
                //释放父进程打开的文件描述符和申请的cfgs空间。
                // for (int i = 3; i < NOFILE; i++)
                //     close(i);

                proxy *pro = NULL;
                if ((*it)->protocol == PROTOCOL_TCP)
                {
                    pro = new tcpproxy(*it);
                }
                else if ((*it)->protocol == PROTOCOL_UDP)
                {
                }
                else if ((*it)->protocol == PROTOCOL_HTTP)
                {
                    pro = new httpproxy(*it);
                }
                pro->startproxy();
                exit(0);
            }
            else if (pid < 0)
            {
                exit(0);
            }
        }
        else
        {

            proxy *pro = NULL;
            if ((*it)->protocol == PROTOCOL_TCP)
            {
                pro = new tcpproxy(*it);
            }
            else if ((*it)->protocol == PROTOCOL_UDP)
            {
            }
            else if ((*it)->protocol == PROTOCOL_HTTP)
            {
                pro = new httpproxy(*it);
            }
            pro->startproxy();
        }
    }
    return 0;
}